

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exchange_dt.h
# Opt level: O0

void __thiscall GatherBcast::kernel(GatherBcast *this,int param_2,int param_3)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long in_RDI;
  int i;
  double min_dt;
  double *tmps;
  double tmp [4];
  int local_4c;
  double local_48;
  double *local_40;
  undefined8 local_38;
  double local_30;
  double local_28;
  double local_20;
  
  local_38 = *(undefined8 *)(in_RDI + 0x10);
  local_30 = (double)*(int *)(in_RDI + 0x18);
  local_28 = (double)*(int *)(in_RDI + 0x1c);
  local_20 = (double)*(int *)(in_RDI + 0x20);
  local_40 = (double *)0x0;
  if (*(int *)(in_RDI + 8) == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(*(int *)(in_RDI + 0xc) << 2);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_40 = (double *)operator_new__(uVar2);
  }
  MPI_Gather(&local_38,4,&ompi_mpi_double,local_40,4,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  local_48 = -1.0;
  if (*(int *)(in_RDI + 8) == 0) {
    local_48 = *local_40;
    for (local_4c = 1; local_4c < *(int *)(in_RDI + 0xc); local_4c = local_4c + 1) {
      if (local_40[local_4c << 2] < local_48) {
        local_48 = local_40[local_4c << 2];
      }
    }
  }
  MPI_Bcast(&local_48,1,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  if ((*(int *)(in_RDI + 8) == 0) && (local_40 != (double *)0x0)) {
    operator_delete__(local_40);
  }
  return;
}

Assistant:

inline void kernel(int, int) override
    {
        double tmp[4];
        tmp[0] = dt;
        tmp[1] = x;
        tmp[2] = y;
        tmp[3] = z;

        double* tmps = nullptr;
        if (rank == 0) tmps = new double[4  * n_processes];

        MPI_Gather(tmp, 4, MPI_DOUBLE, tmps, 4, MPI_DOUBLE, 0, MPI_COMM_WORLD);

        double min_dt = -1;
        if (rank == 0)
        {
            min_dt = tmps[0];
            for (int i = 1; i < n_processes; i++)
                if (tmps[4 * i] < min_dt) min_dt = tmps[4 * i];
        }
        MPI_Bcast(&min_dt, 1, MPI_DOUBLE, 0, MPI_COMM_WORLD);
#ifdef DEBUG_MODE
        std::cout << "rank " << rank << " min dt " << min_dt << "\n";
#endif
        if (rank == 0) delete[] tmps;
    }